

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_meshb_long(FILE *file,REF_INT version,REF_LONG *value)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uStackY_30;
  int int_value;
  long long_value;
  
  if (version < 4) {
    sVar1 = fread(&int_value,4,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar2 = "int value";
      uStackY_30 = 0x2a;
LAB_00192999:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
             uStackY_30,"ref_part_meshb_long",pcVar2,1,sVar1);
      return 1;
    }
    long_value = (long)int_value;
  }
  else {
    sVar1 = fread(&long_value,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar2 = "long value";
      uStackY_30 = 0x2d;
      goto LAB_00192999;
    }
  }
  *value = long_value;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_long(FILE *file, REF_INT version,
                                              REF_LONG *value) {
  int int_value;
  long long_value;
  if (version < 4) {
    REIS(1, fread(&int_value, sizeof(int), 1, file), "int value");
    *value = (REF_LONG)int_value;
  } else {
    REIS(1, fread(&long_value, sizeof(long), 1, file), "long value");
    *value = long_value;
  }
  return REF_SUCCESS;
}